

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall
Array_MultiLineWithItem_Test::Array_MultiLineWithItem_Test(Array_MultiLineWithItem_Test *this)

{
  Array_MultiLineWithItem_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Array_MultiLineWithItem_Test_002279f8;
  return;
}

Assistant:

TEST(Array, MultiLineWithItem) {
    std::istringstream input("key = [\n\r\n \t6 \r\n \n]\r\n ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_array},
        {sax_event_t::integer, 6},
        {sax_event_t::finish_array, 1},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}